

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool camp::test::array::begin(void)

{
  iterator pvVar1;
  const_iterator pvVar2;
  bool bVar3;
  bool local_2b;
  bool passed;
  const_iterator b_it;
  array<int,_2UL> *b;
  iterator a_it;
  array<int,_2UL> a;
  
  a_it = (iterator)0x800000001;
  pvVar1 = array<int,_2UL>::begin((array<int,_2UL> *)&a_it);
  pvVar2 = array<int,_2UL>::begin((array<int,_2UL> *)&a_it);
  bVar3 = false;
  if (*pvVar1 == 1) {
    bVar3 = false;
    if (pvVar1[1] == 8) {
      bVar3 = false;
      if (*pvVar2 == 1) {
        bVar3 = pvVar2[1] == 8;
      }
    }
  }
  pvVar1 = array<int,_2UL>::begin((array<int,_2UL> *)&a_it);
  *pvVar1 = 4;
  pvVar2 = array<int,_2UL>::begin((array<int,_2UL> *)&a_it);
  local_2b = false;
  if (bVar3) {
    local_2b = false;
    if (*pvVar1 == 4) {
      local_2b = false;
      if (pvVar1[1] == 8) {
        local_2b = false;
        if (*pvVar2 == 4) {
          local_2b = pvVar2[1] == 8;
        }
      }
    }
  }
  return local_2b;
}

Assistant:

CAMP_TEST_BEGIN(array, begin)
{
   camp::array<int, 2> a = {1, 8};
   auto a_it = a.begin();

   const camp::array<int, 2>& b{a};
   auto b_it = b.begin();

   bool passed = *a_it++ == 1 &&
                 *a_it++ == 8 &&
                 *b_it++ == 1 &&
                 *b_it++ == 8;

   a_it = a.begin();
   *a_it = 4;
   b_it = b.begin();

   return passed &&
          *a_it++ == 4 &&
          *a_it++ == 8 &&
          *b_it++ == 4 &&
          *b_it++ == 8;
}